

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RecursiveDescentParser.cpp
# Opt level: O0

shared_ptr<MyCompiler::Block> __thiscall
MyCompiler::RecursiveDescentParser::parse<MyCompiler::Block>(RecursiveDescentParser *this)

{
  element_type *peVar1;
  element_type *__x;
  __shared_count<(__gnu_cxx::_Lock_policy)2> extraout_RDX;
  long in_RSI;
  shared_ptr<MyCompiler::Block> sVar2;
  undefined1 local_70 [16];
  undefined1 local_60 [16];
  undefined1 local_50 [32];
  undefined1 local_30 [32];
  RecursiveDescentParser *this_local;
  shared_ptr<MyCompiler::Block> *pResult;
  
  local_30[0x17] = 0;
  this_local = this;
  std::make_shared<MyCompiler::Block>();
  if (*(int *)(in_RSI + 0x30) == 0x1c) {
    parse<MyCompiler::ConstDeclaration>((RecursiveDescentParser *)local_30);
    peVar1 = std::__shared_ptr_access<MyCompiler::Block,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
             operator->((__shared_ptr_access<MyCompiler::Block,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)this);
    std::shared_ptr<MyCompiler::ConstDeclaration>::operator=
              (&peVar1->pConstDeclaration,(shared_ptr<MyCompiler::ConstDeclaration> *)local_30);
    std::shared_ptr<MyCompiler::ConstDeclaration>::~shared_ptr
              ((shared_ptr<MyCompiler::ConstDeclaration> *)local_30);
  }
  if (*(int *)(in_RSI + 0x30) == 0x1d) {
    parse<MyCompiler::VarDeclaration>((RecursiveDescentParser *)local_50);
    peVar1 = std::__shared_ptr_access<MyCompiler::Block,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
             operator->((__shared_ptr_access<MyCompiler::Block,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)this);
    std::shared_ptr<MyCompiler::VarDeclaration>::operator=
              (&peVar1->pVarDeclaration,(shared_ptr<MyCompiler::VarDeclaration> *)local_50);
    std::shared_ptr<MyCompiler::VarDeclaration>::~shared_ptr
              ((shared_ptr<MyCompiler::VarDeclaration> *)local_50);
  }
  while (*(int *)(in_RSI + 0x30) == 0x1e) {
    peVar1 = std::__shared_ptr_access<MyCompiler::Block,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
             operator->((__shared_ptr_access<MyCompiler::Block,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)this);
    parse<MyCompiler::ProcedureDeclaration>((RecursiveDescentParser *)local_60);
    __x = std::
          __shared_ptr_access<MyCompiler::ProcedureDeclaration,_(__gnu_cxx::_Lock_policy)2,_false,_false>
          ::operator*((__shared_ptr_access<MyCompiler::ProcedureDeclaration,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       *)local_60);
    std::vector<MyCompiler::ProcedureDeclaration,_std::allocator<MyCompiler::ProcedureDeclaration>_>
    ::push_back(&peVar1->vProcedureDeclaration,__x);
    std::shared_ptr<MyCompiler::ProcedureDeclaration>::~shared_ptr
              ((shared_ptr<MyCompiler::ProcedureDeclaration> *)local_60);
  }
  parse<MyCompiler::Statement>((RecursiveDescentParser *)local_70);
  peVar1 = std::__shared_ptr_access<MyCompiler::Block,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<MyCompiler::Block,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       *)this);
  std::shared_ptr<MyCompiler::Statement>::operator=
            (&peVar1->pStatement,(shared_ptr<MyCompiler::Statement> *)local_70);
  std::shared_ptr<MyCompiler::Statement>::~shared_ptr((shared_ptr<MyCompiler::Statement> *)local_70)
  ;
  sVar2.super___shared_ptr<MyCompiler::Block,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       extraout_RDX._M_pi;
  sVar2.super___shared_ptr<MyCompiler::Block,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)this;
  return (shared_ptr<MyCompiler::Block>)
         sVar2.super___shared_ptr<MyCompiler::Block,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

std::shared_ptr<MyCompiler::Block> MyCompiler::RecursiveDescentParser::parse()
{
    auto pResult = std::make_shared<Block>();

    if (sym == SymbolType::CONST)
        pResult->pConstDeclaration = parse<ConstDeclaration>();
    if (sym == SymbolType::VAR)
        pResult->pVarDeclaration = parse<VarDeclaration>();
    while (sym == SymbolType::PROC)
        pResult->vProcedureDeclaration.push_back(*parse<ProcedureDeclaration>());
    pResult->pStatement = parse<Statement>();

    return pResult;
}